

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseUse(Parser *this)

{
  bool bVar1;
  Token *this_00;
  pointer this_01;
  Position *pos_00;
  type pEVar2;
  size_t sVar3;
  Parser *in_RSI;
  undefined1 local_d0 [16];
  __normal_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  local_c0;
  const_iterator local_b8;
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  const_iterator local_90;
  undefined1 local_88 [8];
  BiOpExpr *biopexpr;
  Exprs exprs;
  Position pos;
  undefined1 local_48 [8];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  undefined1 local_38 [24];
  Token *local_20;
  Token *tok;
  Parser *this_local;
  
  this_local = this;
  sanityExpect(in_RSI,TOK_KW_USE);
  bVar1 = expect(in_RSI,TOK_KW_MOD);
  if (bVar1) {
    local_20 = Lexer::getCurrentToken(in_RSI->lexer);
    bVar1 = expect(in_RSI,TOK_ID);
    if (bVar1) {
      std::make_unique<pfederc::ProgNameExpr,pfederc::Lexer&,pfederc::Token_const*&>
                ((Lexer *)&expr,(Token **)in_RSI->lexer);
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<pfederc::ProgNameExpr,std::default_delete<pfederc::ProgNameExpr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                 (unique_ptr<pfederc::ProgNameExpr,_std::default_delete<pfederc::ProgNameExpr>_> *)
                 &expr);
      std::unique_ptr<pfederc::ProgNameExpr,_std::default_delete<pfederc::ProgNameExpr>_>::
      ~unique_ptr((unique_ptr<pfederc::ProgNameExpr,_std::default_delete<pfederc::ProgNameExpr>_> *)
                  &expr);
    }
    else {
      local_38._6_2_ = 2;
      local_38._0_4_ = 8;
      this_00 = Lexer::getCurrentToken(in_RSI->lexer);
      Token::getPosition(this_00);
      std::
      make_unique<pfederc::Error<pfederc::SyntaxErrorCode>,pfederc::Level,pfederc::SyntaxErrorCode,pfederc::Position_const&>
                ((Level *)(local_38 + 8),(SyntaxErrorCode *)(local_38 + 6),(Position *)local_38);
      generateError((Parser *)(local_38 + 0x10),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_38 + 0x10));
      std::
      unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
      ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)(local_38 + 8));
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0
                );
    }
  }
  else {
    parseExpression((Parser *)local_48,(Precedence)in_RSI);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_48);
    if (bVar1) {
      this_01 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                          ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                           local_48);
      pos_00 = Expr::getPosition(this_01);
      Position::Position((Position *)
                         &exprs.
                          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,pos_00);
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                *)&biopexpr);
      while( true ) {
        pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_48);
        bVar1 = isBiOpExpr(pEVar2,TOK_OP_COMMA);
        if (!bVar1) break;
        pEVar2 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator*
                           ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
                            local_48);
        sVar3 = __dynamic_cast(pEVar2,&Expr::typeinfo,&BiOpExpr::typeinfo,0);
        if (sVar3 == 0) {
          __cxa_bad_cast();
        }
        local_88 = (undefined1  [8])sVar3;
        local_a0._8_8_ =
             std::
             vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ::begin((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                      *)&biopexpr);
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
        ::__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>*>
                  ((__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                    *)&local_90,
                   (__normal_iterator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                    *)(local_a0 + 8));
        BiOpExpr::getRightPtr((BiOpExpr *)local_a0);
        local_b0._8_8_ =
             std::
             vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             ::insert((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                       *)&biopexpr,local_90,(value_type *)local_a0);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_a0);
        BiOpExpr::getLeftPtr((BiOpExpr *)local_b0);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator=
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_48,
                   (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_b0);
        std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
                  ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_b0);
      }
      local_c0._M_current =
           (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
           std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::begin((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    *)&biopexpr);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
      ::__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>*>
                ((__normal_iterator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                  *)&local_b8,&local_c0);
      local_d0._8_8_ =
           std::
           vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ::insert((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                     *)&biopexpr,local_b8,(value_type *)local_48);
      std::
      make_unique<pfederc::UseExpr,pfederc::Lexer&,pfederc::Position&,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                ((Lexer *)local_d0,(Position *)in_RSI->lexer,
                 (vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                  *)&exprs.
                     super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<pfederc::UseExpr,std::default_delete<pfederc::UseExpr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,
                 (unique_ptr<pfederc::UseExpr,_std::default_delete<pfederc::UseExpr>_> *)local_d0);
      std::unique_ptr<pfederc::UseExpr,_std::default_delete<pfederc::UseExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::UseExpr,_std::default_delete<pfederc::UseExpr>_> *)local_d0);
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                 *)&biopexpr);
    }
    else {
      std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
      unique_ptr<std::default_delete<pfederc::Expr>,void>
                ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)this,(nullptr_t)0x0
                );
    }
    std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
              ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_48);
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseUse() noexcept {
  sanityExpect(TokenType::TOK_KW_USE);
  if (expect(TokenType::TOK_KW_MOD)) {
    const Token *tok = lexer.getCurrentToken();
    if (!expect(TokenType::TOK_ID)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_ID, lexer.getCurrentToken()->getPosition()));
      return nullptr;
    }

    return std::make_unique<ProgNameExpr>(lexer, tok);
  }

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr)
    return nullptr;

  Position pos(expr->getPosition());

  Exprs exprs;
  while (isBiOpExpr(*expr, TokenType::TOK_OP_COMMA)) {
    BiOpExpr& biopexpr = dynamic_cast<BiOpExpr&>(*expr);
    exprs.insert(exprs.begin(), biopexpr.getRightPtr());
    expr = biopexpr.getLeftPtr();
  }

  exprs.insert(exprs.begin(), std::move(expr));

  return std::make_unique<UseExpr>(lexer, pos, std::move(exprs));
}